

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

LibraryIncDirClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LibraryIncDirClauseSyntax,slang::syntax::LibraryIncDirClauseSyntax_const&>
          (BumpAllocator *this,LibraryIncDirClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  LibraryIncDirClauseSyntax *pLVar13;
  
  pLVar13 = (LibraryIncDirClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((LibraryIncDirClauseSyntax *)this->endPtr < pLVar13 + 1) {
    pLVar13 = (LibraryIncDirClauseSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pLVar13 + 1);
  }
  (pLVar13->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pLVar13->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pLVar13->super_SyntaxNode).field_0x4 = uVar5;
  (pLVar13->super_SyntaxNode).parent = pSVar1;
  TVar9 = (args->minus).kind;
  uVar10 = (args->minus).field_0x2;
  NVar11.raw = (args->minus).numFlags.raw;
  uVar12 = (args->minus).rawLen;
  pIVar2 = (args->minus).info;
  uVar6 = (args->incdir).field_0x2;
  NVar7.raw = (args->incdir).numFlags.raw;
  uVar8 = (args->incdir).rawLen;
  pIVar3 = (args->incdir).info;
  (pLVar13->incdir).kind = (args->incdir).kind;
  (pLVar13->incdir).field_0x2 = uVar6;
  (pLVar13->incdir).numFlags = (NumericTokenFlags)NVar7.raw;
  (pLVar13->incdir).rawLen = uVar8;
  (pLVar13->incdir).info = pIVar3;
  (pLVar13->minus).kind = TVar9;
  (pLVar13->minus).field_0x2 = uVar10;
  (pLVar13->minus).numFlags = (NumericTokenFlags)NVar11.raw;
  (pLVar13->minus).rawLen = uVar12;
  (pLVar13->minus).info = pIVar2;
  uVar5 = *(undefined4 *)&(args->filePaths).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->filePaths).super_SyntaxListBase.super_SyntaxNode.parent;
  (pLVar13->filePaths).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->filePaths).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pLVar13->filePaths).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pLVar13->filePaths).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pLVar13->filePaths).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->filePaths).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pLVar13->filePaths).super_SyntaxListBase.childCount =
       (args->filePaths).super_SyntaxListBase.childCount;
  (pLVar13->filePaths).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005cbf18;
  sVar4 = (args->filePaths).elements._M_extent._M_extent_value;
  (pLVar13->filePaths).elements._M_ptr = (args->filePaths).elements._M_ptr;
  (pLVar13->filePaths).elements._M_extent._M_extent_value = sVar4;
  return pLVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }